

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<bool,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  long in_RCX;
  byte in_DL;
  AttributeValueIndex in_ESI;
  long in_RDI;
  int i_1;
  bool in_value;
  int i;
  uint8_t *src_address;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int iVar4;
  int iVar5;
  uint8_t *local_28;
  byte local_11 [17];
  
  local_11[0] = in_DL;
  local_28 = GetAddress((GeometryAttribute *)
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_ESI);
  iVar4 = 0;
  while( true ) {
    iVar5 = iVar4;
    pbVar3 = std::min<unsigned_char>((uchar *)(in_RDI + 0x18),local_11);
    if ((int)(uint)*pbVar3 <= iVar4) {
      for (uVar2 = (uint)*(byte *)(in_RDI + 0x18); (int)uVar2 < (int)(uint)local_11[0];
          uVar2 = uVar2 + 1) {
        *(undefined8 *)(in_RCX + (long)(int)uVar2 * 8) = 0;
      }
      return true;
    }
    bVar1 = IsAddressValid((GeometryAttribute *)CONCAT44(in_ESI.value_,iVar5),
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    if (!bVar1) break;
    in_stack_ffffffffffffffcc = CONCAT13(*local_28,(int3)in_stack_ffffffffffffffcc) & 0x1ffffff;
    bVar1 = ConvertComponentValue<bool,long>
                      ((bool *)&stack0xffffffffffffffcf,(bool)(*(byte *)(in_RDI + 0x20) & 1),
                       (long *)(in_RCX + (long)iVar5 * 8));
    if (!bVar1) {
      return false;
    }
    local_28 = local_28 + 1;
    iVar4 = iVar5 + 1;
  }
  return false;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }